

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AssemblyCommand.cpp
# Opt level: O2

string * __thiscall
AssemblyCode::CJumpNotEqualCommand::ToString_abi_cxx11_
          (string *__return_storage_ptr__,CJumpNotEqualCommand *this)

{
  string sStack_f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  string local_38;
  
  IRT::CTemp::ToString_abi_cxx11_(&local_38,&this->leftOperand);
  std::operator+(&local_d8,"cmp ",&local_38);
  std::operator+(&local_b8,&local_d8," ");
  IRT::CTemp::ToString_abi_cxx11_(&sStack_f8,&this->rightOperand);
  std::operator+(&local_98,&local_b8,&sStack_f8);
  std::operator+(&local_78,&local_98,"\njne ");
  std::operator+(&local_58,&local_78,&(this->super_AbstractJumpCommand).label);
  std::operator+(__return_storage_ptr__,&local_58,"\n");
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::~string((string *)&local_78);
  std::__cxx11::string::~string((string *)&local_98);
  std::__cxx11::string::~string((string *)&sStack_f8);
  std::__cxx11::string::~string((string *)&local_b8);
  std::__cxx11::string::~string((string *)&local_d8);
  std::__cxx11::string::~string((string *)&local_38);
  return __return_storage_ptr__;
}

Assistant:

std::string AssemblyCode::CJumpNotEqualCommand::ToString( ) const {
    return "cmp " + leftOperand.ToString( ) + " " + rightOperand.ToString( ) + "\njne " + label + "\n";
}